

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O1

LY_ERR lyd_new_implicit_all(lyd_node **tree,ly_ctx *ctx,uint32_t implicit_options,lyd_node **diff)

{
  lyd_node *plVar1;
  lysc_node *plVar2;
  ly_ctx *plVar3;
  LY_ERR LVar4;
  lys_module *plVar5;
  char *pcVar6;
  lyd_node **diff_00;
  uint32_t i;
  lyd_node *d;
  uint32_t local_3c;
  lyd_node *local_38;
  
  local_38 = (lyd_node *)0x0;
  local_3c = 0;
  if (tree == (lyd_node **)0x0) {
    pcVar6 = "tree";
  }
  else {
    plVar1 = *tree;
    if (ctx != (ly_ctx *)0x0 || plVar1 != (lyd_node *)0x0) {
      if (plVar1 != (lyd_node *)0x0) {
        plVar2 = plVar1->schema;
        if (plVar2 == (lysc_node *)0x0) {
          if (ctx == (ly_ctx *)0x0) goto LAB_0013029f;
          plVar3 = (ly_ctx *)plVar1[2].schema;
        }
        else {
          if (ctx == (ly_ctx *)0x0) goto LAB_0013029f;
          plVar3 = plVar2->module->ctx;
        }
        if (plVar3 != (ly_ctx *)0x0) {
          if (plVar2 == (lysc_node *)0x0) {
            plVar5 = (lys_module *)&plVar1[2].schema;
          }
          else {
            plVar5 = plVar2->module;
          }
          if (plVar5->ctx != ctx) {
            if (plVar2 == (lysc_node *)0x0) {
              plVar5 = (lys_module *)&plVar1[2].schema;
            }
            else {
              plVar5 = plVar2->module;
            }
            ly_log(plVar5->ctx,LY_LLERR,LY_EINVAL,
                   "Different contexts mixed in a single function call.");
            return LY_EINVAL;
          }
        }
      }
LAB_0013029f:
      if (diff != (lyd_node **)0x0) {
        *diff = (lyd_node *)0x0;
      }
      if (ctx == (ly_ctx *)0x0) {
        plVar2 = (*tree)->schema;
        if (plVar2 == (lysc_node *)0x0) {
          plVar5 = (lys_module *)&(*tree)[2].schema;
        }
        else {
          plVar5 = plVar2->module;
        }
        ctx = plVar5->ctx;
      }
      diff_00 = &local_38;
      if (diff == (lyd_node **)0x0) {
        diff_00 = (lyd_node **)0x0;
      }
      plVar5 = ly_ctx_get_module_iter(ctx,&local_3c);
      LVar4 = LY_SUCCESS;
      if (plVar5 != (lys_module *)0x0) {
        do {
          if (plVar5->implemented != '\0') {
            LVar4 = lyd_new_implicit_module(tree,plVar5,implicit_options,diff_00);
            if (LVar4 != LY_SUCCESS) goto LAB_0013033f;
            if (local_38 != (lyd_node *)0x0) {
              lyd_insert_sibling(*diff,local_38,diff);
              local_38 = (lyd_node *)0x0;
            }
          }
          plVar5 = ly_ctx_get_module_iter(ctx,&local_3c);
        } while (plVar5 != (lys_module *)0x0);
        LVar4 = LY_SUCCESS;
      }
LAB_0013033f:
      if (diff == (lyd_node **)0x0) {
        return LVar4;
      }
      if (LVar4 == LY_SUCCESS) {
        return LY_SUCCESS;
      }
      lyd_free_all(*diff);
      *diff = (lyd_node *)0x0;
      return LVar4;
    }
    pcVar6 = "*tree || ctx";
    ctx = (ly_ctx *)0x0;
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar6,"lyd_new_implicit_all");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_implicit_all(struct lyd_node **tree, const struct ly_ctx *ctx, uint32_t implicit_options, struct lyd_node **diff)
{
    const struct lys_module *mod;
    struct lyd_node *d = NULL;
    uint32_t i = 0;
    LY_ERR rc = LY_SUCCESS;

    LY_CHECK_ARG_RET(ctx, tree, *tree || ctx, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(*tree ? LYD_CTX(*tree) : NULL, ctx, LY_EINVAL);
    if (diff) {
        *diff = NULL;
    }
    if (!ctx) {
        ctx = LYD_CTX(*tree);
    }

    /* add nodes for each module one-by-one */
    while ((mod = ly_ctx_get_module_iter(ctx, &i))) {
        if (!mod->implemented) {
            continue;
        }

        LY_CHECK_GOTO(rc = lyd_new_implicit_module(tree, mod, implicit_options, diff ? &d : NULL), cleanup);
        if (d) {
            /* merge into one diff */
            lyd_insert_sibling(*diff, d, diff);

            d = NULL;
        }
    }

cleanup:
    if (rc && diff) {
        lyd_free_all(*diff);
        *diff = NULL;
    }
    return rc;
}